

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-linux.c
# Opt level: O0

FUNCTION_RETURN getModuleName(char *buffer)

{
  uint uVar1;
  int iVar2;
  FUNCTION_RETURN FVar3;
  ssize_t sVar4;
  int ch;
  pid_t pid;
  char pidStr [64];
  char proc_path [4096];
  char path [4096];
  FUNCTION_RETURN result;
  char *buffer_local;
  
  memset(proc_path + 0xff8,0,0x1000);
  uVar1 = getpid();
  sprintf((char *)&ch,"%d",(ulong)uVar1);
  strcpy(pidStr + 0x38,"/proc/");
  strcat(pidStr + 0x38,(char *)&ch);
  strcat(pidStr + 0x38,"/exe");
  sVar4 = readlink(pidStr + 0x38,proc_path + 0xff8,0xfff);
  iVar2 = (int)sVar4;
  if (iVar2 == -1) {
    path[0xffc] = '\x02';
    path[0xffd] = '\0';
    path[0xffe] = '\0';
    path[0xfff] = '\0';
  }
  else {
    proc_path[(long)iVar2 + 0xff8] = '\0';
    strncpy(buffer,proc_path + 0xff8,(long)iVar2);
    path[0xffc] = '\0';
    path[0xffd] = '\0';
    path[0xffe] = '\0';
    path[0xfff] = '\0';
  }
  FVar3._0_1_ = path[0xffc];
  FVar3._1_1_ = path[0xffd];
  FVar3._2_1_ = path[0xffe];
  FVar3._3_1_ = path[0xfff];
  return FVar3;
}

Assistant:

FUNCTION_RETURN getModuleName(char buffer[MAX_PATH]) {
	FUNCTION_RETURN result;
	char path[MAX_PATH] = { 0 };
	char proc_path[MAX_PATH], pidStr[64];
	pid_t pid = getpid();
	sprintf(pidStr, "%d", pid);
	strcpy(proc_path, "/proc/");
	strcat(proc_path, pidStr);
	strcat(proc_path, "/exe");

	int ch = readlink(proc_path, path, MAX_PATH-1);
	if (ch != -1) {
		path[ch] = '\0';
		strncpy(buffer, path, ch);
		result = FUNC_RET_OK;
	} else {
		result = FUNC_RET_ERROR;
	}
	return result;
}